

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

void processEvents(SWindowData *window_data)

{
  long lVar1;
  int iVar2;
  long *in_RDI;
  bool bVar3;
  SWindowData_X11 *window_data_x11;
  XEvent event;
  undefined1 local_c8 [16];
  XEvent *in_stack_ffffffffffffff48;
  SWindowData *in_stack_ffffffffffffff50;
  
  lVar1 = *in_RDI;
  while( true ) {
    bVar3 = false;
    if ((*(byte *)((long)in_RDI + 0x2a2) & 1) == 0) {
      iVar2 = XPending(*(undefined8 *)(lVar1 + 8));
      bVar3 = iVar2 != 0;
    }
    if (!bVar3) break;
    XNextEvent(*(undefined8 *)(lVar1 + 8),local_c8);
    processEvent(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

static void 
processEvents(SWindowData *window_data) {
    XEvent          event;
    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;

    while ((window_data->close == false) && XPending(window_data_x11->display)) {
        XNextEvent(window_data_x11->display, &event);
        processEvent(window_data, &event);
    }
}